

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

bool __thiscall
CMU462::StaticScene::BVHAccel::find_closest_hit
          (BVHAccel *this,Ray *ray,BVHNode *node,Intersection *isect)

{
  bool bVar1;
  uint uVar2;
  const_reference ppPVar3;
  BVHNode *in_RCX;
  Ray *in_RDX;
  BVHAccel *in_RSI;
  long in_RDI;
  double *unaff_retaddr;
  double *in_stack_00000008;
  Ray *in_stack_00000010;
  BBox *in_stack_00000018;
  bool true_hit;
  double second_t;
  BVHNode *second;
  BVHNode *first;
  double t1_r;
  double t0_r;
  double t1_l;
  double t0_l;
  bool hit_r;
  bool hit_l;
  size_t p;
  bool hit;
  bool local_79;
  double local_78;
  double local_58;
  double local_48;
  bool local_3a;
  bool local_39;
  double local_38;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_1;
  
  bVar1 = BVHNode::isLeaf((BVHNode *)in_RDX);
  if (bVar1) {
    local_1 = false;
    for (local_38 = (in_RDX->inv_d).x;
        (ulong)local_38 < (ulong)((long)(in_RDX->inv_d).x + (long)(in_RDX->inv_d).y);
        local_38 = (double)((long)local_38 + 1)) {
      ppPVar3 = std::
                vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                ::operator[]((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                              *)(in_RDI + 8),(size_type)local_38);
      uVar2 = (*(*ppPVar3)->_vptr_Primitive[2])(*ppPVar3,in_RSI,in_RCX);
      local_1 = local_1 != false || (uVar2 & 1) != 0;
    }
  }
  else {
    if ((BVHNode *)(in_RDX->inv_d).z == (BVHNode *)0x0) {
      local_39 = false;
    }
    else {
      local_39 = BBox::intersect(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr
                                );
    }
    if (*(BVHNode **)in_RDX->sign == (BVHNode *)0x0) {
      local_3a = false;
    }
    else {
      local_3a = BBox::intersect(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr
                                );
    }
    if ((local_39 == false) && (local_3a == false)) {
      local_1 = false;
    }
    else if ((local_39 == false) && (local_3a != false)) {
      local_1 = find_closest_hit(in_RSI,in_RDX,in_RCX,
                                 (Intersection *)
                                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    }
    else if ((local_3a == false) && (local_39 != false)) {
      local_1 = find_closest_hit(in_RSI,in_RDX,in_RCX,
                                 (Intersection *)
                                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    }
    else {
      if (local_58 < local_48) {
        local_78 = local_48;
      }
      else {
        local_78 = local_58;
      }
      local_79 = find_closest_hit(in_RSI,in_RDX,in_RCX,
                                  (Intersection *)
                                  CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      if ((!local_79) || (local_78 < (in_RCX->bb).max.x)) {
        bVar1 = find_closest_hit(in_RSI,in_RDX,in_RCX,
                                 (Intersection *)
                                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
        local_79 = local_79 || bVar1;
      }
      local_1 = local_79;
    }
  }
  return local_1;
}

Assistant:

bool BVHAccel::find_closest_hit(const Ray &ray, BVHNode* node, Intersection *isect) const {
	if (node->isLeaf()) {
		bool hit = false;
		for (size_t p = node->start; p < node->start + node->range; ++p) {
			hit = hit | primitives[p]->intersect(ray, isect);
		}
		return hit;
	}
	else {
		bool hit_l, hit_r;
		double t0_l, t1_l, t0_r, t1_r;
		if (node->l == NULL) hit_l = false;
		else hit_l = node->l->bb.intersect(ray, t0_l, t1_l);
		if (node->r == NULL) hit_r = false;
		else hit_r = node->r->bb.intersect(ray, t0_r, t1_r);
		
		if (!hit_l && !hit_r) return false;
		else if (!hit_l && hit_r) {
			return find_closest_hit(ray, node->r, isect);
		}
		else if (!hit_r && hit_l) {
			return find_closest_hit(ray, node->l, isect);
		}
		else {
			BVHNode* first, *second;
			double second_t;
			bool true_hit;
			if (t0_l <= t0_r) {
				first = node->l;
				second = node->r;
				second_t = t0_r;
			}
			else {
				first = node->r;
				second = node->l;
				second_t = t0_l;
			}

			true_hit = find_closest_hit(ray, first, isect);
			if (!true_hit || isect->t > second_t) {
				true_hit = true_hit | find_closest_hit(ray, second, isect);
			}
			return true_hit;
		}
	}
}